

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlutils.cpp
# Opt level: O2

bool QXmlUtils::rangeContains(RangeIter begin,RangeIter end,QChar c)

{
  ushort *puVar1;
  undefined1 auVar2 [16];
  RangeIter pQVar3;
  RangeIter pQVar4;
  long lVar5;
  
  pQVar3 = begin;
  if ((ushort)c.ucs <= begin->max) {
LAB_002cfeef:
    return pQVar3->min <= (ushort)c.ucs;
  }
  pQVar3 = begin + 1;
  if (pQVar3 != end) {
    if ((ushort)c.ucs <= begin[1].max) goto LAB_002cfeef;
    do {
      if (pQVar3 == end) {
        return false;
      }
      lVar5 = (long)end - (long)pQVar3 >> 2;
      auVar2._8_8_ = (long)end - (long)pQVar3 >> 0x3f;
      auVar2._0_8_ = lVar5;
      pQVar4 = pQVar3 + SUB168(auVar2 / SEXT816(2),0);
      if ((pQVar4->min <= (ushort)c.ucs) &&
         (puVar1 = &pQVar4->max, pQVar3 = pQVar4, pQVar4 = end, (ushort)c.ucs <= *puVar1)) {
        return true;
      }
      end = pQVar4;
    } while (2 < lVar5 + 1U);
  }
  return false;
}

Assistant:

bool QXmlUtils::rangeContains(RangeIter begin, RangeIter end, const QChar c)
{
    const ushort cp(c.unicode());

    // check the first two ranges "manually" as characters in that
    // range are checked very often and we avoid the binary search below.

    if (cp <= begin->max)
        return cp >= begin->min;

    ++begin;

    if (begin == end)
        return false;

    if (cp <= begin->max)
        return cp >= begin->min;

    while (begin != end) {
        qptrdiff delta = (end - begin) / 2;
        RangeIter mid = begin + delta;

        if (mid->min > cp)
            end = mid;
        else if (mid->max < cp)
            begin = mid;
        else
            return true;

        if (delta == 0)
            break;
    }

    return false;
}